

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O0

void chart_ramp_array(nk_context *nk,nk_color color,int count,unsigned_short *values)

{
  nk_color highlight;
  int iVar1;
  nk_flags nVar2;
  char local_438 [8];
  char buffer [1024];
  uint local_30;
  int i;
  unsigned_short *values_local;
  int count_local;
  nk_context *nk_local;
  nk_color color_local;
  
  highlight = nk_rgb(0xff,0xff,0xff);
  iVar1 = nk_chart_begin_colored(nk,NK_CHART_LINES,color,highlight,count,0.0,65535.0);
  if (iVar1 != 0) {
    for (local_30 = 0; (int)local_30 < count; local_30 = local_30 + 1) {
      nVar2 = nk_chart_push(nk,(float)values[(int)local_30]);
      if (nVar2 != 0) {
        snprintf(local_438,0x400,"#%u: %u (%0.5f) ",(double)((float)values[(int)local_30] / 65535.0)
                 ,(ulong)local_30,(ulong)values[(int)local_30]);
        nk_tooltip(nk,local_438);
      }
    }
    nk_chart_end(nk);
  }
  return;
}

Assistant:

static void chart_ramp_array(struct nk_context* nk,
                             struct nk_color color,
                             int count, unsigned short int* values)
{
    if (nk_chart_begin_colored(nk, NK_CHART_LINES,
                               color, nk_rgb(255, 255, 255),
                               count, 0, 65535))
    {
        int i;
        for (i = 0;  i < count;  i++)
        {
            char buffer[1024];
            if (nk_chart_push(nk, values[i]))
            {
                snprintf(buffer, sizeof(buffer), "#%u: %u (%0.5f) ",
                         i, values[i], values[i] / 65535.f);
                nk_tooltip(nk, buffer);
            }
        }

        nk_chart_end(nk);
    }
}